

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

void __thiscall
GraphPropagator::fullExpl(GraphPropagator *this,vector<Lit,_std::allocator<Lit>_> *ps)

{
  uint uVar1;
  iterator iVar2;
  undefined8 in_RAX;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  undefined8 local_38;
  
  uVar4 = (this->vs).sz;
  local_38 = in_RAX;
  if (0 < (int)uVar4) {
    lVar7 = 8;
    lVar6 = 0;
    pcVar3 = sat.assigns.data;
    do {
      uVar1 = *(uint *)((long)&(((this->vs).data)->super_Var).super_Branching._vptr_Branching +
                       lVar7);
      if (pcVar3[uVar1] != 0) {
        iVar5 = (uint)((byte)pcVar3[uVar1] < 0xfe) + uVar1 * 2;
        local_38 = CONCAT44(iVar5,local_38._0_4_);
        iVar2._M_current =
             (ps->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar2._M_current ==
            (ps->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                    (ps,iVar2,(Lit *)((long)&local_38 + 4));
          pcVar3 = sat.assigns.data;
        }
        else {
          (iVar2._M_current)->x = iVar5;
          (ps->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar2._M_current + 1;
        }
        uVar4 = (this->vs).sz;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < (int)uVar4);
  }
  uVar4 = (this->es).sz;
  if (0 < (int)uVar4) {
    lVar7 = 8;
    lVar6 = 0;
    pcVar3 = sat.assigns.data;
    do {
      uVar1 = *(uint *)((long)&(((this->es).data)->super_Var).super_Branching._vptr_Branching +
                       lVar7);
      if (pcVar3[uVar1] != 0) {
        iVar5 = (uint)((byte)pcVar3[uVar1] < 0xfe) + uVar1 * 2;
        local_38 = CONCAT44(local_38._4_4_,iVar5);
        iVar2._M_current =
             (ps->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar2._M_current ==
            (ps->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>(ps,iVar2,(Lit *)&local_38);
          pcVar3 = sat.assigns.data;
        }
        else {
          (iVar2._M_current)->x = iVar5;
          (ps->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar2._M_current + 1;
        }
        uVar4 = (this->es).sz;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < (int)uVar4);
  }
  return;
}

Assistant:

void GraphPropagator::fullExpl(std::vector<Lit>& ps) {
	for (int i = 0; i < nbNodes(); i++) {
		if (getNodeVar(i).isFixed()) {
			ps.push_back(getNodeVar(i).getValLit());
		}
	}
	for (int i = 0; i < nbEdges(); i++) {
		if (getEdgeVar(i).isFixed()) {
			ps.push_back(getEdgeVar(i).getValLit());
		}
	}
}